

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O3

int __thiscall Fl_Text_Buffer::remove(Fl_Text_Buffer *this,char *__filename)

{
  int extraout_EAX;
  char *__ptr;
  int in_EDX;
  int iVar1;
  int iVar2;
  long lVar3;
  int end;
  
  iVar2 = (int)__filename;
  end = in_EDX;
  if (in_EDX < iVar2) {
    end = iVar2;
  }
  if (iVar2 < in_EDX) {
    in_EDX = iVar2;
  }
  iVar2 = this->mLength;
  if (iVar2 <= in_EDX) {
    in_EDX = iVar2;
  }
  if (in_EDX < 1) {
    in_EDX = 0;
  }
  if (iVar2 <= end) {
    end = iVar2;
  }
  if (end < 1) {
    end = 0;
  }
  iVar1 = end - in_EDX;
  if (iVar1 == 0) {
    return iVar2;
  }
  if (0 < this->mNPredeleteProcs) {
    lVar3 = 0;
    do {
      (*this->mPredeleteProcs[lVar3])(in_EDX,iVar1,this->mPredeleteCbArgs[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->mNPredeleteProcs);
  }
  __ptr = text_range(this,in_EDX,end);
  remove_(this,in_EDX,end);
  this->mCursorPosHint = in_EDX;
  if (0 < this->mNModifyProcs) {
    lVar3 = 0;
    do {
      (*this->mModifyProcs[lVar3])(in_EDX,0,iVar1,0,__ptr,this->mCbArgs[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->mNModifyProcs);
  }
  free(__ptr);
  return extraout_EAX;
}

Assistant:

void Fl_Text_Buffer::remove(int start, int end)
{
  /* Make sure the arguments make sense */
  if (start > end) {
    int temp = start;
    start = end;
    end = temp;
  }
  if (start > mLength)
    start = mLength;
  if (start < 0)
    start = 0;
  if (end > mLength)
    end = mLength;
  if (end < 0)
    end = 0;

  IS_UTF8_ALIGNED2(this, (start))
  IS_UTF8_ALIGNED2(this, (end))  
  
  if (start == end)
    return;
  
  call_predelete_callbacks(start, end - start);
  /* Remove and redisplay */
  const char *deletedText = text_range(start, end);
  remove_(start, end);
  mCursorPosHint = start;
  call_modify_callbacks(start, end - start, 0, 0, deletedText);
  free((void *) deletedText);
}